

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

void __thiscall wasm::Literal::Literal(Literal *this,shared_ptr<wasm::GCData> *gcData,HeapType type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  element_type *peVar5;
  
  peVar5 = (gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->field_0).i64 = (int64_t)peVar5;
  p_Var1 = (gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar5 = (gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->type).id = (uint)(peVar5 == (element_type *)0x0) * 2 | type.id;
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) != 0) {
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  bVar3 = wasm::Type::isData(&this->type);
  if ((!bVar3) ||
     ((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0)) {
    uVar4 = (uint)type.id & 0x7b;
    if (uVar4 == 8 && type.id < 0x7d) {
      if ((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0) {
        return;
      }
    }
    else if (0x7c < type.id) goto LAB_00c2f51b;
    if (((4 < (uVar4 << 0x1d | uVar4 - 8 >> 3) - 10) ||
        ((gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
         (element_type *)0x0)) &&
       (((0x7c < type.id ||
         (((uVar4 != 0x20 ||
           (peVar5 = (gcData->super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
           peVar5 == (element_type *)0x0)) || (uVar2 = (peVar5->type).id, 0x7c < uVar2)))) ||
        (((uint)uVar2 & 0x7b) != 0x50)))) {
LAB_00c2f51b:
      __assert_fail("(isData() && gcData) || (type.isMaybeShared(HeapType::ext) && gcData) || (type.isBottom() && !gcData) || (type.isMaybeShared(HeapType::any) && gcData && gcData->type.isMaybeShared(HeapType::string))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x54,"wasm::Literal::Literal(std::shared_ptr<GCData>, HeapType)");
    }
  }
  return;
}

Assistant:

Literal::Literal(std::shared_ptr<GCData> gcData, HeapType type)
  : gcData(gcData), type(type, gcData ? NonNullable : Nullable) {
  // TODO: Use exact types for gcData.
  // The type must be a proper type for GC data: either a struct, array, or
  // string; or an externalized version of the same; or a null; or an
  // internalized string (which appears as an anyref).
  assert((isData() && gcData) ||
         (type.isMaybeShared(HeapType::ext) && gcData) ||
         (type.isBottom() && !gcData) ||
         (type.isMaybeShared(HeapType::any) && gcData &&
          gcData->type.isMaybeShared(HeapType::string)));
}